

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall
TimerTest_detachedWithIterations_Test::TestBody(TimerTest_detachedWithIterations_Test *this)

{
  char *pcVar1;
  duration<long,_std::ratio<1L,_1000000000L>_> local_80;
  AssertionResult gtest_ar;
  __basic_future<void> local_68;
  future_status local_58;
  future_status local_54;
  promise<void> promise;
  size_t iterations;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  iterations = 0;
  std::promise<void>::promise(&promise);
  local_18 = std::
             _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:107:35)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(jessilib::timer_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp:107:35)>
             ::_M_manager;
  local_30._M_unused._M_object = &iterations;
  local_30._8_8_ = &promise;
  jessilib::timer::timer((timer *)&gtest_ar,1000000,4);
  jessilib::timer::detach();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar.message_);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  std::__basic_future<void>::__basic_future(&local_68,&promise._M_future);
  local_80.__r = 0x394c549ef0000;
  local_54 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1000000000l>>
                       (&local_68,&local_80);
  local_58 = ready;
  testing::internal::CmpHelperEQ<std::future_status,std::future_status>
            ((internal *)&gtest_ar,"promise.get_future().wait_for(timeout * 1000000)",
             "std::future_status::ready",&local_54,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/timer.cpp"
               ,0x72,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if (local_68._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (*(local_68._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr__State_baseV2[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::promise<void>::~promise(&promise);
  return;
}

Assistant:

TEST(TimerTest, detachedWithIterations) {
	size_t iterations{ 0 };
	std::promise<void> promise;

	{
		timer{period, total_iterations, [&iterations, &promise]([[maybe_unused]] timer& in_timer) {
			if (++iterations == total_iterations) {
				promise.set_value();
			}
		}}.detach();
	}

	EXPECT_EQ(promise.get_future().wait_for(timeout * 1000000), std::future_status::ready);
}